

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O3

Aig_Obj_t * Aig_CreateOr(Aig_Man_t *p,int nVars)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *p0;
  int i;
  
  p0 = p->pConst1;
  if (0 < nVars) {
    i = 0;
    do {
      pAVar1 = Aig_IthVar(p,i);
      p0 = Aig_And(p,p0,(Aig_Obj_t *)((ulong)pAVar1 ^ 1));
      i = i + 1;
    } while (nVars != i);
  }
  return (Aig_Obj_t *)((ulong)p0 ^ 1);
}

Assistant:

Aig_Obj_t * Aig_CreateOr( Aig_Man_t * p, int nVars )
{
    Aig_Obj_t * pFunc;
    int i;
    pFunc = Aig_ManConst0( p );
    for ( i = 0; i < nVars; i++ )
        pFunc = Aig_Or( p, pFunc, Aig_IthVar(p, i) );
    return pFunc;
}